

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatinbuilder.cpp
# Opt level: O0

UBool __thiscall
icu_63::CollationFastLatinBuilder::forData
          (CollationFastLatinBuilder *this,CollationData *data,UErrorCode *errorCode)

{
  UBool UVar1;
  bool local_39;
  UBool ok;
  UErrorCode *errorCode_local;
  CollationData *data_local;
  CollationFastLatinBuilder *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    UVar1 = UnicodeString::isEmpty(&this->result);
    if (UVar1 == '\0') {
      *errorCode = U_INVALID_STATE_ERROR;
      this_local._7_1_ = false;
    }
    else {
      UVar1 = loadGroups(this,data,errorCode);
      if (UVar1 == '\0') {
        this_local._7_1_ = false;
      }
      else {
        this->firstShortPrimary = this->firstDigitPrimary;
        getCEs(this,data,errorCode);
        UVar1 = encodeUniqueCEs(this,errorCode);
        if (UVar1 == '\0') {
          this_local._7_1_ = false;
        }
        else {
          if (this->shortPrimaryOverflow != '\0') {
            this->firstShortPrimary = this->firstLatinPrimary;
            resetCEs(this);
            getCEs(this,data,errorCode);
            UVar1 = encodeUniqueCEs(this,errorCode);
            if (UVar1 == '\0') {
              return '\0';
            }
          }
          local_39 = false;
          if (this->shortPrimaryOverflow == '\0') {
            UVar1 = encodeCharCEs(this,errorCode);
            local_39 = false;
            if (UVar1 != '\0') {
              UVar1 = encodeContractions(this,errorCode);
              local_39 = UVar1 != '\0';
            }
          }
          UVector64::removeAllElements(&this->contractionCEs);
          UVector64::removeAllElements(&this->uniqueCEs);
          this_local._7_1_ = local_39;
        }
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

UBool
CollationFastLatinBuilder::forData(const CollationData &data, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return FALSE; }
    if(!result.isEmpty()) {  // This builder is not reusable.
        errorCode = U_INVALID_STATE_ERROR;
        return FALSE;
    }
    if(!loadGroups(data, errorCode)) { return FALSE; }

    // Fast handling of digits.
    firstShortPrimary = firstDigitPrimary;
    getCEs(data, errorCode);
    if(!encodeUniqueCEs(errorCode)) { return FALSE; }
    if(shortPrimaryOverflow) {
        // Give digits long mini primaries,
        // so that there are more short primaries for letters.
        firstShortPrimary = firstLatinPrimary;
        resetCEs();
        getCEs(data, errorCode);
        if(!encodeUniqueCEs(errorCode)) { return FALSE; }
    }
    // Note: If we still have a short-primary overflow but not a long-primary overflow,
    // then we could calculate how many more long primaries would fit,
    // and set the firstShortPrimary to that many after the current firstShortPrimary,
    // and try again.
    // However, this might only benefit the en_US_POSIX tailoring,
    // and it is simpler to suppress building fast Latin data for it in genrb,
    // or by returning FALSE here if shortPrimaryOverflow.

    UBool ok = !shortPrimaryOverflow &&
            encodeCharCEs(errorCode) && encodeContractions(errorCode);
    contractionCEs.removeAllElements();  // might reduce heap memory usage
    uniqueCEs.removeAllElements();
    return ok;
}